

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  _Optional_payload_base<bool> _Var1;
  VariableName VVar2;
  element_type *peVar3;
  _func_int *p_Var4;
  OperatorDefinition *other;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  __shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  size_t i;
  ulong uVar12;
  int i_1;
  size_t i_2;
  long lVar13;
  long lStack_60;
  int aiStack_58 [2];
  UserDefinedOperatorName local_50;
  undefined1 local_48 [8];
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  
  peVar3 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar7 = -((long)(peVar3->definition).numOperands * 4 + 0xfU & 0xfffffffffffffff0);
  lVar6 = lVar7 + -0x58;
  p_Var4 = (peVar3->super_Operator)._vptr_Operator[1];
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x117f59;
  (*p_Var4)(local_48);
  lVar13 = 0;
  for (uVar12 = 0;
      uVar12 < (ulong)((long)operands.
                             super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_48 >> 4);
      uVar12 = uVar12 + 1) {
    p_Var8 = (__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *)local_48;
    *(undefined8 *)((long)&lStack_60 + lVar7) = 0x117f7e;
    iVar10 = ProcessOperator(this,(shared_ptr<const_calc4::Operator> *)
                                  ((long)&p_Var8->_M_ptr + lVar13));
    *(int *)((long)aiStack_58 + uVar12 * 4 + lVar6 + 0x58) = iVar10;
    lVar13 = lVar13 + 0x10;
  }
  peVar3 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  _Var1 = (peVar3->isTailCall).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>;
  if (((ushort)_Var1 >> 8 & 1 & (ushort)_Var1) != 0) {
    other = this->definition;
    *(undefined8 *)((long)&lStack_60 + lVar7) = 0x117fad;
    bVar9 = OperatorDefinition::operator==(&peVar3->definition,other);
    if (bVar9) {
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x3b;
      uVar5 = *(undefined8 *)((long)&lStack_60 + lVar7);
      for (lVar13 = 0;
          lVar13 < (int)((ulong)((long)operands.
                                       super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)local_48)
                        >> 4); lVar13 = lVar13 + 1) {
        *(undefined8 *)((long)&lStack_60 + lVar7) = 0x117fde;
        poVar11 = Append(this);
        *(undefined8 *)((long)&lStack_60 + lVar7) = 0x117fe9;
        poVar11 = operator<<(poVar11,(ArgumentName)(int)lVar13);
        *(undefined8 *)((long)&lStack_60 + lVar7) = 0x117ff4;
        poVar11 = std::operator<<(poVar11," = ");
        VVar2.no = *(int *)((long)aiStack_58 + lVar13 * 4 + lVar6 + 0x58);
        *(undefined8 *)((long)&lStack_60 + lVar7) = 0x118001;
        poVar11 = operator<<(poVar11,VVar2);
        *(undefined8 *)((long)&lStack_60 + lVar7) = 0x11800c;
        poVar11 = std::operator<<(poVar11,(char)uVar5);
        *(undefined8 *)((long)&lStack_60 + lVar7) = 0x118014;
        std::endl<char,std::char_traits<char>>(poVar11);
      }
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180aa;
      poVar11 = Append(this);
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180b9;
      poVar11 = std::operator<<(poVar11,"goto ");
      *(undefined8 *)((long)&lStack_60 + lVar7) = 5;
      lVar6 = *(long *)((long)&lStack_60 + lVar7);
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180cb;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Entry",lVar6);
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x3b;
      uVar5 = *(undefined8 *)((long)&lStack_60 + lVar7);
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180d6;
      poVar11 = std::operator<<(poVar11,(char)uVar5);
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180de;
      std::endl<char,std::char_traits<char>>(poVar11);
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180f0;
      Return(this,(optional<int>)0x1ffffffff);
      goto LAB_001180f0;
    }
  }
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x118021;
  AppendVariableDeclarationBegin(this);
  poVar11 = this->os;
  local_50.definition =
       &((op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->definition;
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x118038;
  poVar11 = operator<<(poVar11,&local_50);
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x28;
  uVar5 = *(undefined8 *)((long)&lStack_60 + lVar7);
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x118043;
  std::operator<<(poVar11,(char)uVar5);
  for (uVar12 = 0;
      uVar12 < (ulong)((long)operands.
                             super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)local_48 >> 4);
      uVar12 = uVar12 + 1) {
    if (uVar12 != 0) {
      poVar11 = this->os;
      *(undefined8 *)((long)&lStack_60 + lVar7) = 0x11806f;
      std::operator<<(poVar11,", ");
    }
    poVar11 = this->os;
    VVar2.no = *(int *)((long)aiStack_58 + uVar12 * 4 + lVar6 + 0x58);
    *(undefined8 *)((long)&lStack_60 + lVar7) = 0x11807d;
    operator<<(poVar11,VVar2);
  }
  poVar11 = this->os;
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x29;
  uVar5 = *(undefined8 *)((long)&lStack_60 + lVar7);
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x11808e;
  std::operator<<(poVar11,(char)uVar5);
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x118096;
  AppendVariableDeclarationEnd(this);
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180a0;
  Return(this,(optional<int>)0x0);
LAB_001180f0:
  *(undefined8 *)((long)&lStack_60 + lVar7) = 0x1180f9;
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
             *)local_48);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        int* operandVariableNos =
            reinterpret_cast<int*>(alloca(sizeof(int) * op->GetDefinition().GetNumOperands()));

        auto operands = op->GetOperands();
        for (size_t i = 0; i < operands.size(); i++)
        {
            operandVariableNos[i] = ProcessOperator(operands[i]);
        }

        if (op->IsTailCall().value_or(false) && op->GetDefinition() == this->definition)
        {
            for (int i = 0; i < static_cast<int>(operands.size()); i++)
            {
                Append() << ArgumentName(i) << " = " << VariableName(operandVariableNos[i]) << ';'
                         << std::endl;
            }

            Append() << "goto " << OperatorEntryLabel() << ';' << std::endl;
            Return(-1);
        }
        else
        {
            AppendVariableDeclarationBegin();
            os << UserDefinedOperatorName(op->GetDefinition()) << '(';
            for (size_t i = 0; i < operands.size(); i++)
            {
                if (i > 0)
                {
                    os << ", ";
                }

                os << VariableName(operandVariableNos[i]);
            }
            os << ')';
            AppendVariableDeclarationEnd();
            Return();
        }
    }